

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::SetMemProtectMode(Recycler *this)

{
  ConfigFlagsTable *pCVar1;
  Recycler *this_local;
  
  this->enableScanInteriorPointers = true;
  this->enableScanImplicitRoots = true;
  this->disableCollectOnAllocationHeuristics = true;
  pCVar1 = GetRecyclerFlagsTable(this);
  this->recyclerStress = (bool)(pCVar1->MemProtectHeapStress & 1);
  pCVar1 = GetRecyclerFlagsTable(this);
  this->recyclerBackgroundStress = (bool)(pCVar1->MemProtectHeapBackgroundStress & 1);
  pCVar1 = GetRecyclerFlagsTable(this);
  this->recyclerConcurrentStress = (bool)(pCVar1->MemProtectHeapConcurrentStress & 1);
  pCVar1 = GetRecyclerFlagsTable(this);
  this->recyclerConcurrentRepeatStress = (bool)(pCVar1->MemProtectHeapConcurrentRepeatStress & 1);
  pCVar1 = GetRecyclerFlagsTable(this);
  this->recyclerPartialStress = (bool)(pCVar1->MemProtectHeapPartialStress & 1);
  return;
}

Assistant:

void
Recycler::SetMemProtectMode()
{
    this->enableScanInteriorPointers = true;
    this->enableScanImplicitRoots = true;
    this->disableCollectOnAllocationHeuristics = true;
#ifdef RECYCLER_STRESS
    this->recyclerStress = GetRecyclerFlagsTable().MemProtectHeapStress;
#if ENABLE_CONCURRENT_GC
    this->recyclerBackgroundStress = GetRecyclerFlagsTable().MemProtectHeapBackgroundStress;
    this->recyclerConcurrentStress = GetRecyclerFlagsTable().MemProtectHeapConcurrentStress;
    this->recyclerConcurrentRepeatStress = GetRecyclerFlagsTable().MemProtectHeapConcurrentRepeatStress;
#endif
#if ENABLE_PARTIAL_GC
    this->recyclerPartialStress = GetRecyclerFlagsTable().MemProtectHeapPartialStress;
#endif
#endif
}